

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int compare2u(void *a,void *b)

{
  uint y;
  uint x;
  void *b_local;
  void *a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else if (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) {
    a_local._4_4_ = -1;
  }
  else if (*(uint *)((long)b + 4) < *(uint *)((long)a + 4)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int compare2u(const void* a, const void*b)
{
  unsigned int x = ((const unsigned int*)a)[0];
  unsigned int y = ((const unsigned int*)b)[0];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  x = ((const unsigned int*)a)[1];
  y = ((const unsigned int*)b)[1];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  return 0;
}